

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O2

_Bool build_pit(chunk *c,loc_conflict centre,wchar_t rating)

{
  wchar_t wVar1;
  monster_group_info group_info;
  monster_group_info group_info_00;
  monster_group_info group_info_01;
  monster_group_info group_info_02;
  monster_group_info group_info_03;
  monster_group_info group_info_04;
  monster_group_info group_info_05;
  monster_group_info group_info_06;
  monster_group_info group_info_07;
  monster_group_info group_info_08;
  monster_group_info group_info_09;
  monster_group_info group_info_10;
  monster_group_info group_info_11;
  monster_group_info group_info_12;
  monster_group_info group_info_13;
  monster_group_info group_info_14;
  monster_group_info group_info_15;
  monster_group_info group_info_16;
  monster_group_info group_info_17;
  monster_group_info group_info_18;
  monster_group_info group_info_19;
  monster_group_info group_info_20;
  _Bool _Var2;
  int iVar3;
  wchar_t wVar4;
  int y;
  wchar_t wVar5;
  uint32_t uVar6;
  monster_race *pmVar7;
  loc lVar8;
  loc_conflict lVar9;
  int y_00;
  long lVar10;
  int iVar11;
  int x;
  bool bVar12;
  int y_01;
  int x_00;
  int y_02;
  monster_group_info info;
  loc_conflict centre_local;
  monster_race *what [16];
  
  centre_local = centre;
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,L'\v',L'\x11');
  wVar5 = centre.y;
  if ((c->height <= wVar5) || (c->width <= centre.x)) {
    _Var2 = find_space(&centre_local,L'\v',L'\x11');
    if (!_Var2) {
      return false;
    }
    centre = (loc_conflict)((ulong)centre_local & 0xffffffff);
    wVar5 = centre_local.y;
  }
  iVar3 = centre.x;
  generate_room(c,wVar5 + L'\xfffffffb',iVar3 + L'\xfffffff8',wVar5 + L'\x05',iVar3 + L'\b',L'\0');
  draw_rectangle(c,wVar5 + L'\xfffffffb',iVar3 + L'\xfffffff8',wVar5 + L'\x05',iVar3 + L'\b',
                 FEAT_GRANITE,L'\f',false);
  fill_rectangle(c,wVar5 + L'\xfffffffc',iVar3 + L'\xfffffff9',wVar5 + L'\x04',iVar3 + L'\a',
                 FEAT_FLOOR,L'\0');
  draw_rectangle(c,wVar5 + L'\xfffffffd',iVar3 + L'\xfffffffa',wVar5 + L'\x03',iVar3 + L'\x06',
                 FEAT_GRANITE,L'\v',false);
  generate_hole(c,wVar5 + L'\xfffffffd',iVar3 + L'\xfffffffa',wVar5 + L'\x03',iVar3 + L'\x06',
                FEAT_CLOSED);
  set_pit_type(c->depth,L'\x01');
  event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,dun->pit_type->name);
  wVar1 = dun->pit_type->obj_rarity;
  get_mon_num_prep(mon_pit_hook);
  bVar12 = false;
  for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
    pmVar7 = get_mon_num(c->depth + L'\n',c->depth);
    what[lVar10] = pmVar7;
    bVar12 = (bool)(bVar12 | pmVar7 == (monster_race *)0x0);
  }
  _Var2 = false;
  get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
  if (!bVar12) {
    if ((player->opts).opt[0x18] == true) {
      msg("Monster pit (%s)",dun->pit_type->name);
    }
    for (iVar3 = 0; lVar10 = 1, iVar3 != 0xf; iVar3 = iVar3 + 1) {
      for (; lVar10 != 0x10; lVar10 = lVar10 + 1) {
        pmVar7 = what[lVar10 + -1];
        if (what[lVar10]->level < pmVar7->level) {
          what[lVar10 + -1] = what[lVar10];
          what[lVar10] = pmVar7;
        }
      }
    }
    for (lVar10 = 0; lVar10 != 0x40; lVar10 = lVar10 + 8) {
      *(undefined8 *)((long)what + lVar10) = *(undefined8 *)((long)what + lVar10 * 2);
    }
    add_to_monster_rating(c,dun->pit_type->ave / 0x14 + 3);
    wVar4 = monster_group_index_new((chunk_conflict *)c);
    lVar9 = centre_local;
    place_new_monster(c,(loc)centre_local,what[7],false,false,
                      (monster_group_info)ZEXT416((uint)wVar4),'\f');
    iVar3 = lVar9.x;
    y_00 = wVar5 + L'\xfffffffe';
    y = wVar5 + L'\x02';
    for (iVar11 = iVar3 + -3; iVar11 <= iVar3 + 3; iVar11 = iVar11 + 1) {
      lVar8 = (loc)loc(iVar11,y_00);
      group_info.role = 1;
      group_info.index = wVar4;
      group_info.player_race = (player_race *)0x0;
      place_new_monster(c,lVar8,what[0],false,false,group_info,'\f');
      lVar8 = (loc)loc(iVar11,y);
      group_info_00.role = 1;
      group_info_00.index = wVar4;
      group_info_00.player_race = (player_race *)0x0;
      place_new_monster(c,lVar8,what[0],false,false,group_info_00,'\f');
    }
    for (iVar11 = iVar3 + -5; iVar11 <= iVar3 + -4; iVar11 = iVar11 + 1) {
      lVar8 = (loc)loc(iVar11,y_00);
      group_info_01.role = 1;
      group_info_01.index = wVar4;
      group_info_01.player_race = (player_race *)0x0;
      place_new_monster(c,lVar8,what[1],false,false,group_info_01,'\f');
      lVar8 = (loc)loc(iVar11,y);
      group_info_02.role = 1;
      group_info_02.index = wVar4;
      group_info_02.player_race = (player_race *)0x0;
      place_new_monster(c,lVar8,what[1],false,false,group_info_02,'\f');
    }
    for (iVar11 = iVar3 + 4; iVar11 <= iVar3 + 5; iVar11 = iVar11 + 1) {
      lVar8 = (loc)loc(iVar11,y_00);
      group_info_03.role = 1;
      group_info_03.index = wVar4;
      group_info_03.player_race = (player_race *)0x0;
      place_new_monster(c,lVar8,what[1],false,false,group_info_03,'\f');
      lVar8 = (loc)loc(iVar11,y);
      group_info_04.role = 1;
      group_info_04.index = wVar4;
      group_info_04.player_race = (player_race *)0x0;
      place_new_monster(c,lVar8,what[1],false,false,group_info_04,'\f');
    }
    y_02 = wVar5 + L'\x01';
    y_01 = wVar5 + L'\xffffffff';
    for (iVar11 = y_01; iVar11 <= y_02; iVar11 = iVar11 + 1) {
      lVar8 = (loc)loc(iVar3 + -5,iVar11);
      group_info_05.role = 1;
      group_info_05.index = wVar4;
      group_info_05.player_race = (player_race *)0x0;
      place_new_monster(c,lVar8,what[0],false,false,group_info_05,'\f');
      lVar8 = (loc)loc(iVar3 + 5,iVar11);
      group_info_06.role = 1;
      group_info_06.index = wVar4;
      group_info_06.player_race = (player_race *)0x0;
      place_new_monster(c,lVar8,what[0],false,false,group_info_06,'\f');
      lVar8 = (loc)loc(iVar3 + -4,iVar11);
      group_info_07.role = 1;
      group_info_07.index = wVar4;
      group_info_07.player_race = (player_race *)0x0;
      place_new_monster(c,lVar8,what[1],false,false,group_info_07,'\f');
      lVar8 = (loc)loc(iVar3 + 4,iVar11);
      group_info_08.role = 1;
      group_info_08.index = wVar4;
      group_info_08.player_race = (player_race *)0x0;
      place_new_monster(c,lVar8,what[1],false,false,group_info_08,'\f');
      lVar8 = (loc)loc(iVar3 + -3,iVar11);
      group_info_09.role = 1;
      group_info_09.index = wVar4;
      group_info_09.player_race = (player_race *)0x0;
      place_new_monster(c,lVar8,what[2],false,false,group_info_09,'\f');
      lVar8 = (loc)loc(iVar3 + 3,iVar11);
      group_info_10.role = 1;
      group_info_10.index = wVar4;
      group_info_10.player_race = (player_race *)0x0;
      place_new_monster(c,lVar8,what[2],false,false,group_info_10,'\f');
      lVar8 = (loc)loc(iVar3 + -2,iVar11);
      group_info_11.role = 1;
      group_info_11.index = wVar4;
      group_info_11.player_race = (player_race *)0x0;
      place_new_monster(c,lVar8,what[3],false,false,group_info_11,'\f');
      lVar8 = (loc)loc(iVar3 + 2,iVar11);
      group_info_12.role = 1;
      group_info_12.index = wVar4;
      group_info_12.player_race = (player_race *)0x0;
      place_new_monster(c,lVar8,what[3],false,false,group_info_12,'\f');
    }
    x = iVar3 + -1;
    lVar8 = (loc)loc(x,y_01);
    group_info_13.role = 1;
    group_info_13.index = wVar4;
    group_info_13.player_race = (player_race *)0x0;
    place_new_monster(c,lVar8,what[4],false,false,group_info_13,'\f');
    x_00 = iVar3 + 1;
    lVar8 = (loc)loc(x_00,y_01);
    group_info_14.role = 1;
    group_info_14.index = wVar4;
    group_info_14.player_race = (player_race *)0x0;
    place_new_monster(c,lVar8,what[4],false,false,group_info_14,'\f');
    lVar8 = (loc)loc(x,y_02);
    group_info_15.role = 1;
    group_info_15.index = wVar4;
    group_info_15.player_race = (player_race *)0x0;
    place_new_monster(c,lVar8,what[4],false,false,group_info_15,'\f');
    lVar8 = (loc)loc(x_00,y_02);
    group_info_16.role = 1;
    group_info_16.index = wVar4;
    group_info_16.player_race = (player_race *)0x0;
    place_new_monster(c,lVar8,what[4],false,false,group_info_16,'\f');
    for (iVar11 = x; iVar11 <= x_00; iVar11 = iVar11 + 1) {
      lVar8 = (loc)loc(iVar11,y_02);
      group_info_17.role = 1;
      group_info_17.index = wVar4;
      group_info_17.player_race = (player_race *)0x0;
      place_new_monster(c,lVar8,what[5],false,false,group_info_17,'\f');
      lVar8 = (loc)loc(iVar11,y_01);
      group_info_18.role = 1;
      group_info_18.index = wVar4;
      group_info_18.player_race = (player_race *)0x0;
      place_new_monster(c,lVar8,what[5],false,false,group_info_18,'\f');
    }
    lVar8 = (loc)loc(x_00,wVar5);
    group_info_19.role = 1;
    group_info_19.index = wVar4;
    group_info_19.player_race = (player_race *)0x0;
    place_new_monster(c,lVar8,what[6],false,false,group_info_19,'\f');
    lVar8 = (loc)loc(x,wVar5);
    group_info_20.role = 1;
    group_info_20.index = wVar4;
    group_info_20.player_race = (player_race *)0x0;
    place_new_monster(c,lVar8,what[6],false,false,group_info_20,'\f');
    for (; iVar11 = iVar3 + -9, y_00 <= y; y_00 = y_00 + 1) {
      for (; iVar11 <= iVar3 + 9; iVar11 = iVar11 + 1) {
        wVar5 = Rand_div(100);
        if (wVar5 < wVar1) {
          lVar9 = loc(iVar11,y_00);
          wVar5 = c->depth;
          uVar6 = Rand_div(3);
          place_object((chunk_conflict *)c,lVar9,wVar5 + L'\n',uVar6 == 0,false,'\x04',L'\0');
        }
      }
    }
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

bool build_pit(struct chunk *c, struct loc centre, int rating)
{
	struct monster_race *what[16];
	int i, j, y, x, y1, x1, y2, x2;
	bool empty = false;
	int light = false;
	int alloc_obj;
	int height = 9;
	int width = 15;
	int group_index = 0;
	struct monster_group_info info = { 0, 0, 0 };

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* Large room */
	y1 = centre.y - height / 2;
	y2 = centre.y + height / 2;
	x1 = centre.x - width / 2;
	x2 = centre.x + width / 2;

	/* Generate new room, outer walls and inner floor */
	generate_room(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, light);
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_OUTER, false);
	fill_rectangle(c, y1, x1, y2, x2, FEAT_FLOOR, SQUARE_NONE);

	/* Advance to the center room */
	y1 = y1 + 2;
	y2 = y2 - 2;
	x1 = x1 + 2;
	x2 = x2 - 2;

	/* Generate inner walls; add one door as entrance */
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_INNER, false);
	generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);

	/* Decide on the pit type */
	set_pit_type(c->depth, 1);
	event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, dun->pit_type->name);

	/* Chance of objects on the floor */
	alloc_obj = dun->pit_type->obj_rarity;
	
	/* Prepare allocation table */
	get_mon_num_prep(mon_pit_hook);

	/* Pick some monster types */
	for (i = 0; i < 16; i++) {
		/* Get a (hard) monster type */
		what[i] = get_mon_num(c->depth + 10, c->depth);

		/* Notice failure */
		if (!what[i]) empty = true;
	}

	/* Prepare allocation table */
	get_mon_num_prep(NULL);

	/* Oops */
	if (empty)
		return false;

	ROOM_LOG("Monster pit (%s)", dun->pit_type->name);

	/* Sort the entries XXX XXX XXX */
	for (i = 0; i < 16 - 1; i++) {
		/* Sort the entries */
		for (j = 0; j < 16 - 1; j++) {
			int i1 = j;
			int i2 = j + 1;

			int p1 = what[i1]->level;
			int p2 = what[i2]->level;

			/* Bubble */
			if (p1 > p2) {
				struct monster_race *tmp = what[i1];
				what[i1] = what[i2];
				what[i2] = tmp;
			}
		}
	}

	/* Select every other entry */
	for (i = 0; i < 8; i++)
		what[i] = what[i * 2];

	/* Increase the level rating */
	add_to_monster_rating(c, 3 + dun->pit_type->ave / 20);

	/* Get a group ID */
	group_index = monster_group_index_new(c);

	/* Center monster */
	info.index = group_index;
	info.role = MON_GROUP_LEADER;
	place_new_monster(c, centre, what[7], false, false, info, ORIGIN_DROP_PIT);

	/* Remaining monsters are servants */
	info.role = MON_GROUP_SERVANT;

	/* Top and bottom rows (middle) */
	for (x = centre.x - 3; x <= centre.x + 3; x++) {
		place_new_monster(c, loc(x, centre.y - 2), what[0], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(x, centre.y + 2), what[0], false, false, info,
						  ORIGIN_DROP_PIT);
	}
    
	/* Corners */
	for (x = centre.x - 5; x <= centre.x - 4; x++) {
		place_new_monster(c, loc(x, centre.y - 2), what[1], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(x, centre.y + 2), what[1], false, false, info,
						  ORIGIN_DROP_PIT);
	}
    
	for (x = centre.x + 4; x <= centre.x + 5; x++) {
		place_new_monster(c, loc(x, centre.y - 2), what[1], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(x, centre.y + 2), what[1], false, false, info,
						  ORIGIN_DROP_PIT);
	}
    
	/* Corners */

	/* Middle columns */
	for (y = centre.y - 1; y <= centre.y + 1; y++) {
		place_new_monster(c, loc(centre.x - 5, y), what[0], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(centre.x + 5, y), what[0], false, false, info,
						  ORIGIN_DROP_PIT);

		place_new_monster(c, loc(centre.x - 4, y), what[1], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(centre.x + 4, y), what[1], false, false, info,
						  ORIGIN_DROP_PIT);

		place_new_monster(c, loc(centre.x - 3, y), what[2], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(centre.x + 3, y), what[2], false, false, info,
						  ORIGIN_DROP_PIT);

		place_new_monster(c, loc(centre.x - 2, y), what[3], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(centre.x + 2, y), what[3], false, false, info,
						  ORIGIN_DROP_PIT);
	}
    
	/* Corners around the middle monster */
	place_new_monster(c, loc(centre.x - 1, centre.y - 1), what[4], false, false,
					  info, ORIGIN_DROP_PIT);
	place_new_monster(c, loc(centre.x + 1, centre.y - 1), what[4], false, false,
					  info, ORIGIN_DROP_PIT);
	place_new_monster(c, loc(centre.x - 1, centre.y + 1), what[4], false, false,
					  info, ORIGIN_DROP_PIT);
	place_new_monster(c, loc(centre.x + 1, centre.y + 1), what[4], false, false,
					  info, ORIGIN_DROP_PIT);

	/* Above/Below the center monster */
	for (x = centre.x - 1; x <= centre.x + 1; x++) {
		place_new_monster(c, loc(x, centre.y + 1), what[5], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(x, centre.y - 1), what[5], false, false, info,
						  ORIGIN_DROP_PIT);
	}

	/* Next to the center monster */
	place_new_monster(c, loc(centre.x + 1, centre.y), what[6], false, false,
					  info, ORIGIN_DROP_PIT);
	place_new_monster(c, loc(centre.x - 1, centre.y), what[6], false, false,
					  info, ORIGIN_DROP_PIT);

	/* Place some objects */
	for (y = centre.y - 2; y <= centre.y + 2; y++) {
		for (x = centre.x - 9; x <= centre.x + 9; x++) {
			/* Occasionally place an item, making it good 1/3 of the time */
			if (randint0(100) < alloc_obj) 
				place_object(c, loc(x, y), c->depth + 10, one_in_(3), false,
							 ORIGIN_PIT, 0);
		}
	}

	return true;
}